

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

RefAs * __thiscall wasm::Builder::makeRefAs(Builder *this,RefAsOp op,Expression *value)

{
  RefAs *pRVar1;
  RefAs *ret;
  Expression *value_local;
  RefAsOp op_local;
  Builder *this_local;
  
  pRVar1 = MixedArena::alloc<wasm::RefAs>(&this->wasm->allocator);
  pRVar1->op = op;
  pRVar1->value = value;
  ::wasm::RefAs::finalize();
  return pRVar1;
}

Assistant:

RefAs* makeRefAs(RefAsOp op, Expression* value) {
    auto* ret = wasm.allocator.alloc<RefAs>();
    ret->op = op;
    ret->value = value;
    ret->finalize();
    return ret;
  }